

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_extract.cpp
# Opt level: O1

void duckdb::MapExtractValueFunc(DataChunk *args,ExpressionState *state,Vector *result)

{
  ulong *puVar1;
  UnifiedVectorFormat *pUVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar3;
  undefined8 uVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  reference list_v;
  reference target_v;
  Vector *source_v;
  Vector *pVVar6;
  list_entry_t *plVar7;
  UnifiedVectorFormat *pUVar8;
  TemplatedValidityData<unsigned_long> *pTVar9;
  UnifiedVectorFormat *pUVar10;
  long lVar11;
  idx_t idx_in_entry;
  UnifiedVectorFormat *pUVar12;
  UnifiedVectorFormat pos_format;
  UnifiedVectorFormat lst_format;
  Vector pos_vec;
  undefined8 local_158;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_150;
  unsigned_long local_148;
  LogicalType local_140 [24];
  long *local_128;
  long local_120;
  long local_118;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e8;
  long *local_e0 [2];
  long local_d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  Vector local_98 [8];
  LogicalType local_90 [48];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  pUVar2 = *(UnifiedVectorFormat **)(args + 0x18);
  list_v = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  target_v = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,1);
  if ((list_v[8] != (value_type)0x1) && (target_v[8] != (value_type)0x1)) {
    source_v = (Vector *)duckdb::MapVector::GetKeys(list_v);
    pVVar6 = (Vector *)duckdb::MapVector::GetValues(list_v);
    duckdb::LogicalType::LogicalType(local_140,INTEGER);
    duckdb::Vector::Vector(local_98,local_140,pUVar2);
    duckdb::LogicalType::~LogicalType(local_140);
    ListSearchOp<true>(list_v,source_v,target_v,local_98,*(idx_t *)(args + 0x18));
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_128);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_e0);
    duckdb::Vector::ToUnifiedFormat((ulong)local_98,pUVar2);
    duckdb::Vector::ToUnifiedFormat((ulong)list_v,pUVar2);
    plVar7 = ListVector::GetData(list_v);
    FlatVector::VerifyFlatVector(result);
    if (pUVar2 != (UnifiedVectorFormat *)0x0) {
      pUVar12 = (UnifiedVectorFormat *)0x0;
      do {
        pUVar8 = pUVar12;
        if (*local_e0[0] != 0) {
          pUVar8 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_e0[0] + (long)pUVar12 * 4);
        }
        if ((local_d0 == 0) ||
           ((*(ulong *)(local_d0 + ((ulong)pUVar8 >> 6) * 8) >> ((ulong)pUVar8 & 0x3f) & 1) != 0)) {
          pUVar10 = pUVar12;
          if (*local_128 != 0) {
            pUVar10 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_128 + (long)pUVar12 * 4);
          }
          if ((local_118 == 0) ||
             ((*(ulong *)(local_118 + ((ulong)pUVar10 >> 6) * 8) >> ((ulong)pUVar10 & 0x3f) & 1) !=
              0)) {
            lVar11 = (long)*(int *)(local_120 + (long)pUVar10 * 4);
            duckdb::VectorOperations::Copy
                      (pVVar6,result,lVar11 + plVar7[(long)pUVar8].offset,
                       (lVar11 + plVar7[(long)pUVar8].offset) - 1,(ulong)pUVar12);
          }
          else {
            if (*(long *)(result + 0x28) == 0) {
              local_148 = *(unsigned_long *)(result + 0x40);
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_158,&local_148);
              p_Var5 = p_Stack_150;
              uVar4 = local_158;
              local_158 = 0;
              p_Stack_150 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
              *(undefined8 *)(result + 0x30) = uVar4;
              *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var5;
              if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
              }
              if (p_Stack_150 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_150);
              }
              pTVar9 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                 ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                                  (result + 0x30));
              *(unsigned_long **)(result + 0x28) =
                   (pTVar9->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            }
            bVar3 = (byte)pUVar12 & 0x3f;
            puVar1 = (ulong *)(*(long *)(result + 0x28) + ((ulong)pUVar12 >> 6) * 8);
            *puVar1 = *puVar1 & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
          }
        }
        else {
          duckdb::FlatVector::SetNull(result,(ulong)pUVar12,true);
        }
        pUVar12 = pUVar12 + 1;
      } while (pUVar2 != pUVar12);
    }
    if (*(long *)(args + 0x18) == 1) {
      duckdb::Vector::SetVectorType((VectorType)result);
    }
    duckdb::Vector::Verify((ulong)result);
    if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
    }
    if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
    }
    if (local_e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8);
    }
    if (local_108 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_108);
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
    }
    if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
    }
    duckdb::LogicalType::~LogicalType(local_90);
    return;
  }
  duckdb::Vector::SetVectorType((VectorType)result);
  duckdb::ConstantVector::SetNull(result,true);
  duckdb::Vector::Verify((ulong)result);
  return;
}

Assistant:

static void MapExtractValueFunc(DataChunk &args, ExpressionState &state, Vector &result) {
	const auto count = args.size();

	auto &map_vec = args.data[0];
	auto &arg_vec = args.data[1];

	const auto map_is_null = map_vec.GetType().id() == LogicalTypeId::SQLNULL;
	const auto arg_is_null = arg_vec.GetType().id() == LogicalTypeId::SQLNULL;

	if (map_is_null || arg_is_null) {
		// Short-circuit if either the map or the arg is NULL
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		ConstantVector::SetNull(result, true);
		result.Verify(count);
		return;
	}

	auto &key_vec = MapVector::GetKeys(map_vec);
	auto &val_vec = MapVector::GetValues(map_vec);

	// Collect the matching positions
	Vector pos_vec(LogicalType::INTEGER, count);
	ListSearchOp<true>(map_vec, key_vec, arg_vec, pos_vec, args.size());

	UnifiedVectorFormat pos_format;
	UnifiedVectorFormat lst_format;

	pos_vec.ToUnifiedFormat(count, pos_format);
	map_vec.ToUnifiedFormat(count, lst_format);

	const auto pos_data = UnifiedVectorFormat::GetData<int32_t>(pos_format);
	const auto inc_list_data = ListVector::GetData(map_vec);

	auto &result_validity = FlatVector::Validity(result);
	for (idx_t row_idx = 0; row_idx < count; row_idx++) {
		auto lst_idx = lst_format.sel->get_index(row_idx);
		if (!lst_format.validity.RowIsValid(lst_idx)) {
			FlatVector::SetNull(result, row_idx, true);
			continue;
		}

		const auto pos_idx = pos_format.sel->get_index(row_idx);
		if (!pos_format.validity.RowIsValid(pos_idx)) {
			// We didnt find the key in the map, so return NULL
			result_validity.SetInvalid(row_idx);
			continue;
		}

		// Compute the actual position of the value in the map value vector
		const auto pos = inc_list_data[lst_idx].offset + UnsafeNumericCast<idx_t>(pos_data[pos_idx] - 1);
		VectorOperations::Copy(val_vec, result, pos + 1, pos, row_idx);
	}

	if (args.size() == 1) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}

	result.Verify(count);
}